

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O3

void __thiscall Fl_Browser::text(Fl_Browser *this,int line,char *newtext)

{
  FL_BLINE *pFVar1;
  Fl_Image *pFVar2;
  FL_BLINE *a;
  size_t sVar3;
  FL_BLINE *b;
  FL_BLINE *pFVar4;
  FL_BLINE **ppFVar5;
  char *__s;
  
  if ((0 < line) && (line <= this->lines)) {
    a = find_line(this,line);
    __s = "";
    if (newtext != (char *)0x0) {
      __s = newtext;
    }
    sVar3 = strlen(__s);
    b = a;
    if ((int)a->length < (int)sVar3) {
      b = (FL_BLINE *)malloc((long)(int)sVar3 + 0x28);
      Fl_Browser_::replacing(&this->super_Fl_Browser_,a,b);
      this->cache = b;
      pFVar2 = a->icon;
      b->data = a->data;
      b->icon = pFVar2;
      b->length = (short)sVar3;
      b->flags = a->flags;
      pFVar1 = a->prev;
      b->prev = pFVar1;
      ppFVar5 = &pFVar1->next;
      if (pFVar1 == (FL_BLINE *)0x0) {
        ppFVar5 = &this->first;
      }
      *ppFVar5 = b;
      pFVar1 = a->next;
      b->next = pFVar1;
      pFVar4 = (FL_BLINE *)&this->last;
      if (pFVar1 != (FL_BLINE *)0x0) {
        pFVar4 = pFVar1;
      }
      pFVar4->prev = b;
      free(a);
    }
    strcpy(b->txt,__s);
    Fl_Browser_::redraw_line(&this->super_Fl_Browser_,b);
    return;
  }
  return;
}

Assistant:

void Fl_Browser::text(int line, const char* newtext) {
  if (line < 1 || line > lines) return;
  FL_BLINE* t = find_line(line);
  if (!newtext) newtext = "";		// STR #3269
  int l = (int) strlen(newtext);
  if (l > t->length) {
    FL_BLINE* n = (FL_BLINE*)malloc(sizeof(FL_BLINE)+l);
    replacing(t, n);
    cache = n;
    n->data = t->data;
    n->icon = t->icon;
    n->length = (short)l;
    n->flags = t->flags;
    n->prev = t->prev;
    if (n->prev) n->prev->next = n; else first = n;
    n->next = t->next;
    if (n->next) n->next->prev = n; else last = n;
    free(t);
    t = n;
  }
  strcpy(t->txt, newtext);
  redraw_line(t);
}